

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cpp_properties::decode_to_utf8<char_const*,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cpp_properties *this,iterator_range<const_char_*> *code_point)

{
  int iVar1;
  wchar_t __wchar;
  int_type local_94;
  undefined1 local_90 [8];
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  utf8_converter;
  int local_28;
  int_type iStack_24;
  char chr;
  int i;
  int value;
  char *c;
  iterator_range<const_char_*> *code_point_local;
  
  c = (char *)this;
  code_point_local = (iterator_range<const_char_*> *)__return_storage_ptr__;
  _i = boost::iterator_range_detail::
       iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>::begin
                 ((iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
                   *)this);
  std::advance<char_const*,int>((char **)&i,2);
  iStack_24 = 0;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    utf8_converter._95_1_ = *_i;
    iVar1 = (int)(char)utf8_converter._95_1_;
    if (iVar1 - 0x30U < 10) {
      iStack_24 = (iStack_24 * 0x10 + (int)(char)utf8_converter._95_1_) - 0x30;
    }
    else if (iVar1 - 0x41U < 6) {
      iStack_24 = (iStack_24 * 0x10 + (int)(char)utf8_converter._95_1_) - 0x37;
    }
    else if (iVar1 - 0x61U < 6) {
      iStack_24 = (iStack_24 * 0x10 + (int)(char)utf8_converter._95_1_) - 0x57;
    }
    _i = _i + 1;
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)local_90);
  local_94 = iStack_24;
  __wchar = std::char_traits<wchar_t>::to_char_type(&local_94);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,
             (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
              *)local_90,__wchar);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> decode_to_utf8(const boost::iterator_range<ForwardTraversalIterator> &code_point) {
  auto c = code_point.begin();
  // skip unicode escape sequence (\u)
  std::advance(c, 2);
  int value = 0;
  for (int i = 0; i < 4; i++) {
    char chr = *c++;
    switch (chr) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      value = (value << 4) + chr - '0';
      break;
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
      value = (value << 4) + 10 + chr - 'a';
      break;
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
      value = (value << 4) + 10 + chr - 'A';
      break;
    }
  }

  typedef std::codecvt_utf8<wchar_t> convert_typeX;
  std::wstring_convert<convert_typeX, wchar_t> utf8_converter;

  return utf8_converter.to_bytes(std::char_traits<wchar_t>::to_char_type(value));
}